

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmapReader.h
# Opt level: O0

void __thiscall
MmapReader::file_helper::file_helper
          (file_helper *this,string *name,uint64_t size,bool creatnew,bool opencreate)

{
  undefined1 local_108 [8];
  FileReader w_2;
  undefined1 local_c0 [8];
  FileReader w_1;
  undefined1 local_68 [8];
  FileReader w;
  bool opencreate_local;
  bool creatnew_local;
  uint64_t size_local;
  string *name_local;
  file_helper *this_local;
  
  w._62_1_ = opencreate;
  w._63_1_ = creatnew;
  std::__cxx11::string::string((string *)this);
  this->tsize = 0;
  this->trunc = false;
  if ((w._63_1_ & 1) == 0) {
    if ((w._62_1_ & 1) == 0) {
      FileReader::FileReader((FileReader *)local_108,name);
      FileReader::~FileReader((FileReader *)local_108);
    }
    else {
      FileReader::FileReader((FileReader *)local_c0,name);
      FileReader::~FileReader((FileReader *)local_c0);
    }
  }
  else {
    FileReader::FileReader((FileReader *)local_68,name);
    FileReader::~FileReader((FileReader *)local_68);
  }
  return;
}

Assistant:

file_helper(const std::string& name, uint64_t size, bool creatnew, bool opencreate)
            : tsize(0), trunc(false)
        {
            if (creatnew) {
                FileReader w(name, FileReader::createnew);
                //w.truncate(size);
            }
            else if (opencreate) {
                FileReader w(name, FileReader::opencreate);
                //w.truncate(size);
            }
            else {
                FileReader w(name, FileReader::readwrite);
                //w.truncate(size);
            }
        }